

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void swallowed(int first)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool local_34;
  
  if (first == 0) {
    iVar5 = (int)swallowed::lasty;
    iVar2 = (int)swallowed::lastx;
    uVar6 = iVar5 - 1;
    do {
      iVar3 = 3;
      uVar4 = iVar2 - 2;
      do {
        bVar9 = uVar4 < 0x4f;
        uVar4 = uVar4 + 1;
        if (bVar9 && uVar6 < 0x15) {
          dbuf[uVar6][uVar4].effect = 0;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      bVar9 = uVar6 != iVar5 + 1U;
      uVar6 = uVar6 + 1;
    } while (bVar9);
    dbuf_set(level,(int)swallowed::lastx,iVar5,(rm *)0x0,0,0,0,0,0,0,0,0,0,0);
  }
  else {
    memset(dbuf,0,0x9d80);
  }
  iVar2 = monsndx((u.ustuck)->data);
  if (iVar2 - 0x89U < 0x14) {
    iVar5 = 0x93;
    if (iVar2 - 0x89U < 10) {
      iVar5 = 0x89;
    }
    iVar2 = iVar5 + objects[(long)(iVar2 - iVar5) + 0x5f].oc_descr_idx + -0x5f;
  }
  local_34 = '\x01' < u.ux && ((byte)u.uy < 0x15 && u.ux < 'Q');
  bVar11 = -1 < u.ux;
  bVar9 = (byte)u.ux < 0x4f;
  bVar10 = (byte)u.uy < 0x15;
  bVar1 = u.ux - 1;
  if ((bVar1 < 0x4f) && (iVar5 = (int)u.uy, (byte)(u.uy - 1U) < 0x15)) {
    if (local_34) {
      iVar3 = swallow_to_effect(iVar2,0);
      if (iVar5 - 1U < 0x15 && bVar1 - 1 < 0x4f) {
        dbuf[iVar5 - 1U][bVar1].effect = iVar3;
      }
    }
    uVar6 = (uint)u.ux;
    iVar3 = (int)u.uy;
    iVar5 = swallow_to_effect(iVar2,1);
    if (iVar3 - 1U < 0x15 && uVar6 - 1 < 0x4f) {
      dbuf[iVar3 - 1U][uVar6].effect = iVar5;
    }
    if (bVar11 && (bVar10 && bVar9)) {
      uVar7 = (ulong)(byte)u.ux;
      iVar3 = (int)u.uy;
      iVar5 = swallow_to_effect(iVar2,2);
      if (iVar3 - 1U < 0x15 && uVar7 < 0x4f) {
        *(int *)((ulong)(iVar3 - 1U) * 0x780 + 0x31d428 + uVar7 * 0x18) = iVar5;
      }
    }
  }
  if (local_34) {
    iVar3 = (int)u.ux;
    uVar7 = (ulong)(byte)u.uy;
    iVar5 = swallow_to_effect(iVar2,3);
    if (iVar3 - 2U < 0x4f && uVar7 < 0x15) {
      dbuf[uVar7][iVar3 - 1].effect = iVar5;
    }
  }
  display_self();
  if (bVar11 && (bVar10 && bVar9)) {
    uVar7 = (ulong)(byte)u.ux;
    uVar8 = (ulong)(byte)u.uy;
    iVar5 = swallow_to_effect(iVar2,4);
    if (uVar8 < 0x15 && uVar7 < 0x4f) {
      *(int *)(uVar8 * 0x780 + 0x31d428 + uVar7 * 0x18) = iVar5;
    }
  }
  bVar1 = u.ux - 1;
  if ((bVar1 < 0x4f) && (iVar5 = (int)u.uy, (byte)(u.uy + 1U) < 0x15)) {
    if (local_34) {
      iVar3 = swallow_to_effect(iVar2,5);
      if (iVar5 + 1U < 0x15 && bVar1 - 1 < 0x4f) {
        dbuf[iVar5 + 1U][bVar1].effect = iVar3;
      }
    }
    uVar6 = (uint)u.ux;
    iVar3 = (int)u.uy;
    iVar5 = swallow_to_effect(iVar2,6);
    if (iVar3 + 1U < 0x15 && uVar6 - 1 < 0x4f) {
      dbuf[iVar3 + 1U][uVar6].effect = iVar5;
    }
    if (bVar11 && (bVar10 && bVar9)) {
      uVar7 = (ulong)(byte)u.ux;
      iVar5 = (int)u.uy;
      iVar2 = swallow_to_effect(iVar2,7);
      if (iVar5 + 1U < 0x15 && uVar7 < 0x4f) {
        *(int *)((ulong)(iVar5 + 1U) * 0x780 + 0x31d428 + uVar7 * 0x18) = iVar2;
      }
    }
  }
  swallowed::lastx = u.ux;
  swallowed::lasty = u.uy;
  return;
}

Assistant:

void swallowed(int first)
{
    static xchar lastx, lasty;	/* last swallowed position */
    int swallower, left_ok, rght_ok;

    if (first)
	cls();
    else {
	int x, y;
	/* Clear old location */
	for (y = lasty-1; y <= lasty+1; y++)
	    for (x = lastx-1; x <= lastx+1; x++)
		dbuf_set_effect(x,y,0);
	dbuf_set(level, lastx, lasty, NULL, 0,0,0,0,0,0,0,0,0,0); /* remove hero symbol */
    }

    /* Account for e.g. shuffled dragon appearances. */
    swallower = obfuscate_monster(monsndx(u.ustuck->data));
    /* assume isok(u.ux,u.uy) */
    left_ok = isok(u.ux-1,u.uy);
    rght_ok = isok(u.ux+1,u.uy);
    /*
     *  Display the hero surrounded by the monster's stomach.
     */
    if (isok(u.ux, u.uy-1)) {
	if (left_ok)
	    dbuf_set_effect(u.ux-1, u.uy-1, swallow_to_effect(swallower, S_sw_tl));
	dbuf_set_effect(u.ux, u.uy-1, swallow_to_effect(swallower, S_sw_tc));
	if (rght_ok)
	    dbuf_set_effect(u.ux+1, u.uy-1, swallow_to_effect(swallower, S_sw_tr));
    }

    if (left_ok)
	dbuf_set_effect(u.ux-1, u.uy  , swallow_to_effect(swallower, S_sw_ml));
    display_self();
    if (rght_ok)
	dbuf_set_effect(u.ux+1, u.uy  , swallow_to_effect(swallower, S_sw_mr));

    if (isok(u.ux, u.uy+1)) {
	if (left_ok)
	    dbuf_set_effect(u.ux-1, u.uy+1, swallow_to_effect(swallower, S_sw_bl));
	dbuf_set_effect(u.ux, u.uy+1, swallow_to_effect(swallower, S_sw_bc));
	if (rght_ok)
	    dbuf_set_effect(u.ux+1, u.uy+1, swallow_to_effect(swallower, S_sw_br));
    }

    /* Update the swallowed position. */
    lastx = u.ux;
    lasty = u.uy;
}